

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

gzFile mcpl_gzopen(char *filename,char *mode)

{
  gzFile pgVar1;
  char *pcVar2;
  mcu8str rp;
  mcu8str f;
  mcu8str local_50;
  mcu8str local_38;
  
  mcu8str_view_cstr(&local_38,filename);
  mctools_real_path(&local_50,&local_38);
  pcVar2 = filename;
  if (local_50.size != 0) {
    pcVar2 = local_50.c_str;
  }
  if (local_50.c_str == (char *)0x0) {
    pcVar2 = filename;
  }
  pgVar1 = (gzFile)gzopen64(pcVar2,mode);
  mcu8str_dealloc(&local_50);
  return pgVar1;
}

Assistant:

MCPL_LOCAL gzFile mcpl_gzopen( const char * filename, const char * mode )
{
  mcu8str f = mcu8str_view_cstr( filename );
#ifdef _WIN32
  wchar_t* wpath = mctools_path2wpath(&f);//must free(..) return value.
  gzFile res = gzopen_w(wpath,mode);
  free(wpath);
#else
  mcu8str rp = mctools_real_path( &f );
  const char * use_fn = ( rp.c_str && rp.size > 0 ) ? rp.c_str : filename ;
#  ifdef Z_LARGE64
  gzFile res = gzopen64( use_fn, mode );
#  else
  gzFile res = gzopen( use_fn, mode );
#  endif
  mcu8str_dealloc( &rp );
#endif
  return res;
}